

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O3

ON_Locale *
ON_Locale::FromSubtags
          (ON_Locale *__return_storage_ptr__,wchar_t *language_code,wchar_t *script,
          wchar_t *region_identifier)

{
  char *language_code_00;
  char *script_00;
  char *region_identifier_00;
  ON_String s_region_identifier;
  ON_String s_script;
  ON_String s_language_code;
  ON_String local_30;
  ON_String local_28;
  ON_String local_20;
  
  ON_String::ON_String(&local_20,language_code);
  ON_String::ON_String(&local_28,script);
  ON_String::ON_String(&local_30,region_identifier);
  language_code_00 = ON_String::operator_cast_to_char_(&local_20);
  script_00 = ON_String::operator_cast_to_char_(&local_28);
  region_identifier_00 = ON_String::operator_cast_to_char_(&local_30);
  FromSubtags(__return_storage_ptr__,language_code_00,script_00,region_identifier_00);
  ON_String::~ON_String(&local_30);
  ON_String::~ON_String(&local_28);
  ON_String::~ON_String(&local_20);
  return __return_storage_ptr__;
}

Assistant:

ON_Locale ON_Locale::FromSubtags(
  const wchar_t* language_code,
  const wchar_t* script,
  const wchar_t* region_identifier
  )
{
  const ON_String s_language_code(language_code);
  const ON_String s_script(script);
  const ON_String s_region_identifier(region_identifier);
  return ON_Locale::FromSubtags(
    static_cast<const char*>(s_language_code),
    static_cast<const char*>(s_script),
    static_cast<const char*>(s_region_identifier)
    );
}